

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DriveStrengthSyntax>
          (DeepCloneVisitor *this,DriveStrengthSyntax *node,BumpAllocator *alloc)

{
  DriveStrengthSyntax *pDVar1;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone(&node->openParen,alloc);
  local_50 = parsing::Token::deepClone(&node->strength0,alloc);
  local_60 = parsing::Token::deepClone(&node->comma,alloc);
  local_70 = parsing::Token::deepClone(&node->strength1,alloc);
  local_80 = parsing::Token::deepClone(&node->closeParen,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DriveStrengthSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_40,&local_50,&local_60,&local_70,&local_80);
  return (SyntaxNode *)pDVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }